

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O2

void __thiscall
Memory::HeapBlockMap32::L2MapChunk::Set
          (L2MapChunk *this,uint id2,uint pageCount,HeapBlock *heapBlock,HeapBlockType blockType,
          byte bucketIndex)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  undefined8 *in_FS_OFFSET;
  
  if (0xff < id2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x199,"(id2 < L2Count)","id2 < L2Count");
    if (!bVar2) goto LAB_002378c4;
    *puVar3 = 0;
  }
  if (pageCount + id2 < 0x101) {
    puVar3 = (undefined4 *)*in_FS_OFFSET;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x19a,"(id2End <= L2Count)","id2End <= L2Count");
    if (!bVar2) {
LAB_002378c4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  uVar4 = (ulong)id2;
  do {
    if (pageCount + id2 <= uVar4) {
      return;
    }
    if (this->map[uVar4] != (HeapBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                         ,0x19f,"(map[i] == nullptr)","map[i] == nullptr");
      if (!bVar2) goto LAB_002378c4;
      *puVar3 = 0;
    }
    if (this->blockInfo[uVar4].blockType != FreeBlockType) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                         ,0x1a0,
                         "(blockInfo[i].blockType == HeapBlock::HeapBlockType::FreeBlockType)",
                         "blockInfo[i].blockType == HeapBlock::HeapBlockType::FreeBlockType");
      if (!bVar2) goto LAB_002378c4;
      *puVar3 = 0;
    }
    this->map[uVar4] = heapBlock;
    this->blockInfo[uVar4].bucketIndex = bucketIndex;
    this->blockInfo[uVar4].blockType = blockType;
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void
HeapBlockMap32::L2MapChunk::Set(uint id2, uint pageCount, HeapBlock * heapBlock, HeapBlock::HeapBlockType blockType, byte bucketIndex)
{
    uint id2End = id2 + pageCount;

    Assert(id2 < L2Count);
    Assert(id2End <= L2Count);

    for (uint i = id2; i < id2End; i++)
    {
        __analysis_assume(i < L2Count);
        Assert(map[i] == nullptr);
        Assert(blockInfo[i].blockType == HeapBlock::HeapBlockType::FreeBlockType);

        // Set the blockType last, because we will test this first during marking.
        // If it's not FreeBlock, then we expect bucketIndex and heapBlock to be valid.
        map[i] = heapBlock;
        blockInfo[i].bucketIndex = bucketIndex;

        // We need memory barrier here for ARM to ensure that the blockType is set last.
#if defined(_M_ARM32_OR_ARM64)
        MemoryBarrier();
#endif
        blockInfo[i].blockType = blockType;
    }
}